

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

Url * __thiscall Vault::KeyValue::getUrl(Url *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Version VVar1;
  Client *pCVar2;
  long *plVar3;
  long *plVar4;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  string local_50;
  
  VVar1 = this->version_;
  pCVar2 = this->client_;
  if (VVar1 == v1) {
    Vault::operator+(&local_50,"/v1/",&this->mount_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = &local_a0;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_a0 = *plVar4;
      uStack_98 = (undefined4)plVar3[3];
      uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
    }
    else {
      local_a0 = *plVar4;
      local_b0 = (long *)*plVar3;
    }
    local_a8 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (*pCVar2->_vptr_Client[3])(__return_storage_ptr__,pCVar2,&local_b0,path);
  }
  else {
    Vault::operator+(&local_70,"/v1/",&this->mount_);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_90 = &local_80;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_80 = *plVar4;
      uStack_78 = (undefined4)plVar3[3];
      uStack_74 = *(undefined4 *)((long)plVar3 + 0x1c);
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    (*pCVar2->_vptr_Client[3])(__return_storage_ptr__,pCVar2,&local_90,path);
  }
  if (VVar1 == v1) {
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::KeyValue::getUrl(const Vault::Path &path) {
  return version_ == KeyValue::Version::v1
             ? client_.getUrl("/v1/" + mount_ + "/", path)
             : client_.getUrl("/v1/" + mount_ + "/data/", path);
}